

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::ReadLine(StringPiece *input,StringPiece *line)

{
  size_type i;
  ulong uVar1;
  char *pcVar2;
  char cVar3;
  size_type sVar4;
  ulong uVar5;
  
  uVar5 = 1;
  do {
    i = uVar5 - 1;
    uVar1 = input->length_;
    if (uVar1 <= i) {
LAB_002af76d:
      return i < uVar1;
    }
    cVar3 = stringpiece_internal::StringPiece::operator[](input,i);
    if ((cVar3 == '\r') || (cVar3 == '\n')) {
      pcVar2 = input->ptr_;
      sVar4 = stringpiece_internal::StringPiece::CheckSize(i);
      line->ptr_ = pcVar2;
      line->length_ = sVar4;
      pcVar2 = input->ptr_;
      sVar4 = stringpiece_internal::StringPiece::CheckSize(input->length_ - (uVar5 & 0xffffffff));
      input->ptr_ = pcVar2 + (uVar5 & 0xffffffff);
      input->length_ = sVar4;
      goto LAB_002af76d;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool ReadLine(StringPiece* input, StringPiece* line) {
  for (int len = 0; len < input->size(); ++len) {
    if (ascii_isnewline((*input)[len])) {
      *line = StringPiece(input->data(), len);
      ++len;  // advance over the newline
      *input = StringPiece(input->data() + len, input->size() - len);
      return true;
    }
  }
  return false;  // Ran out of input with no newline.
}